

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.cpp
# Opt level: O0

char * __thiscall skiwi::getenv(skiwi *this,char *__name)

{
  char *pcVar1;
  allocator<char> local_1a;
  undefined1 local_19;
  char *local_18;
  string *name_local;
  string *out;
  
  local_19 = 0;
  local_18 = __name;
  name_local = (string *)this;
  pcVar1 = (char *)std::__cxx11::string::c_str();
  pcVar1 = ::getenv(pcVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)this,pcVar1,&local_1a);
  std::allocator<char>::~allocator(&local_1a);
  return (char *)this;
}

Assistant:

std::string getenv(const std::string& name)
  {
#ifdef _WIN32
  std::wstring ws = convert_string_to_wstring(name);
  wchar_t* path = _wgetenv(ws.c_str());
  if (!path)
    return nullptr;
  std::wstring wresult(path);
  std::string out = convert_wstring_to_string(wresult);
#else
  std::string out(::getenv(name.c_str()));
#endif
  return out;
  }